

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  Buffer boot_rom_file;
  timeval tp;
  GB gb;
  Buffer BStack_19d58;
  double dStack_19d38;
  Buffer BStack_19d30;
  GB GStack_19d18;
  
  puVar2 = GStack_19d18.rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ParseArguments(argc,argv);
  BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (s_boot_rom_filename != (char *)0x0) {
    ReadFile(&GStack_19d18.rom,s_boot_rom_filename);
    puVar1 = BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         GStack_19d18.rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         GStack_19d18.rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         GStack_19d18.rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    GStack_19d18.rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    ThrowUnless((long)GStack_19d18.rom.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2 == 0x100,
                "Invalid boot rom size");
  }
  ReadFile(&BStack_19d30,s_filename);
  GB::GB(&GStack_19d18,&BStack_19d30,&BStack_19d58,Guess);
  if (BStack_19d30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(BStack_19d30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  uVar3 = (ulong)(uint)(s_frames * 0x11250);
  gettimeofday((timeval *)&BStack_19d30,(__timezone_ptr_t)0x0);
  dStack_19d38 = (double)(long)BStack_19d30.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish / 1000000.0 +
                 (double)(long)BStack_19d30.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
  if (s_trace == '\0') {
    if (uVar3 != 0) {
      uVar4 = uVar3;
      do {
        GB::Step(&GStack_19d18);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  else if (uVar3 != 0) {
    uVar4 = uVar3;
    do {
      GB::Trace(&GStack_19d18);
      GB::Step(&GStack_19d18);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  gettimeofday((timeval *)&BStack_19d30,(__timezone_ptr_t)0x0);
  dVar5 = ((double)(long)BStack_19d30.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish / 1000000.0 +
          (double)(long)BStack_19d30.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start) - dStack_19d38;
  printf("time: gb=%.1fs host=%.1fs (%.1fx)\n",SUB84((double)uVar3 * 2.384185791015625e-07,0),dVar5,
         ((double)uVar3 * 2.384185791015625e-07) / dVar5);
  if (s_ppm_filename != (char *)0x0) {
    WriteFramePPM(&GStack_19d18,s_ppm_filename);
  }
  if (GStack_19d18.boot_rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(GStack_19d18.boot_rom.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (GStack_19d18.rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(GStack_19d18.rom.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(BStack_19d58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  try {
    ParseArguments(argc, argv);

    Buffer boot_rom_file;
    if (s_boot_rom_filename) {
      boot_rom_file = ReadFile(s_boot_rom_filename);
      ThrowUnless(boot_rom_file.size() == 256, "Invalid boot rom size");
    }

    GB gb(ReadFile(s_filename), std::move(boot_rom_file), Variant::Guess);

    Clock run_clocks = s_frames * 70224u;
    f64 start_time = GetTime();
    if (s_trace) {
      for (Clock i = 0; i < run_clocks; ++i) {
        gb.Trace();
        gb.Step();
      }
    } else {
      for (Clock i = 0; i < run_clocks; ++i) {
        gb.Step();
#if 0
        if (gb.s.pc == 0x100 && gb.s.op_tick == 2) {
          printf("io: {\n  ");
          for (int i = 0; i < 0x4c; ++i) {
            printf("0x%02x,", gb.s.io[i]);
            if (((i+1) & 7) == 0) {
              printf("\n  ");
            }
          }
          printf("\n}\n");
          printf("af=0x%02x\n", gb.s.af);
          printf("bc=0x%02x\n", gb.s.bc);
          printf("de=0x%02x\n", gb.s.de);
          printf("hl=0x%02x\n", gb.s.hl);
          printf("sp=0x%02x\n", gb.s.sp);
          printf("pc=0x%02x\n", gb.s.pc);
          printf("ppu_mode = %d\n", gb.s.ppu_mode);
          printf("ppu_line_y = %d\n", gb.s.ppu_line_y);
          printf("tick = %lu\n", gb.s.tick);
          printf("ppu_lcd_on_tick = %ld\n", gb.s.ppu_lcd_on_tick);
          printf("ppu_line_start_tick = %ld\n", gb.s.ppu_line_start_tick);
          printf("ppu_mode_start_tick = %ld\n", gb.s.ppu_mode_start_tick);
          printf("div_reset_tick = %ld\n", gb.s.div_reset_tick);
        }
#endif
      }
    }
    f64 host_time = GetTime() - start_time;
    f64 gb_time = (f64)run_clocks / CpuClocksPerSec;
    printf("time: gb=%.1fs host=%.1fs (%.1fx)\n", gb_time, host_time,
           gb_time / host_time);

    if (s_ppm_filename) {
      WriteFramePPM(gb, s_ppm_filename);
    }

    return 0;
  } catch (const Error& e) {
    std::cerr << e.what() << "\n";
    return 1;
  }
}